

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

double feintrack::bhattacharrya_dist(hist_cont *source,hist_cont *dest)

{
  long lVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  
  lVar2 = (long)(source->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(source->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar2 == 0) {
    dVar4 = 0.0;
  }
  else {
    lVar2 = lVar2 >> 3;
    lVar1 = 0;
    dVar4 = 0.0;
    do {
      dVar3 = (source->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar1] *
              (dest->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar1];
      if (dVar3 < 0.0) {
        dVar3 = sqrt(dVar3);
      }
      else {
        dVar3 = SQRT(dVar3);
      }
      dVar4 = dVar4 + dVar3;
      lVar1 = lVar1 + 1;
    } while (lVar2 + (ulong)(lVar2 == 0) != lVar1);
  }
  return dVar4;
}

Assistant:

double bhattacharrya_dist(const hist_cont& source, const hist_cont& dest)
	{
		double result = 0;
		for (size_t i = 0, stop_i = source.size(); i < stop_i; ++i)
		{
			result += std::sqrt(source[i] * dest[i]);
		}
		return result;
	}